

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_list.h
# Opt level: O3

iterator * __thiscall obs::safe_list<Observer>::iterator::operator++(iterator *this)

{
  pthread_mutex_t *__mutex;
  node *pnVar1;
  int iVar2;
  
  __mutex = (pthread_mutex_t *)this->m_list;
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  if (this->m_node != (node *)0x0) {
    unlock(this);
    pnVar1 = this->m_node->next;
    this->m_node = pnVar1;
    if (pnVar1 != (node *)0x0) {
      lock(this);
    }
    pthread_mutex_unlock(__mutex);
    return this;
  }
  __assert_fail("m_node",
                "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                ,0xc4,"iterator &obs::safe_list<Observer>::iterator::operator++() [T = Observer]");
}

Assistant:

iterator& operator++() {
      std::lock_guard<std::mutex> l(m_list.m_mutex_nodes);
      assert(m_node);
      if (m_node) {
        unlock();

        // Go to the next node.
        m_node = m_node->next;

        // Lock the new node that we're pointing to now.
        if (m_node)
          lock();
      }
      return *this;
    }